

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImGuiDockNode *pIVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImDrawList *pIVar7;
  ImGuiWindow *pIVar8;
  ImGuiOldColumns *columns;
  char *pcVar9;
  ulong uVar10;
  int n;
  uint uVar11;
  int i;
  ulong uVar12;
  ImGuiDockNode *node;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ImVec2 local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar6 = window->WasActive;
    pIVar8 = GImGui->NavWindow;
    if (bVar6 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar14 = " *Inactive*";
    }
    else {
      pcVar14 = "";
    }
    bVar4 = TreeNodeEx(label,(uint)(pIVar8 == window),"%s \'%s\'%s",label,window->Name,pcVar14);
    if (bVar6 == false) {
      PopStyleColor(1);
    }
    bVar5 = IsItemHovered(0);
    if ((bVar5 & bVar6) == 1) {
      pIVar7 = GetForegroundDrawList(window);
      local_68.x = (window->Size).x + (window->Pos).x;
      local_68.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(pIVar7,&window->Pos,&local_68,0xff00ffff,0.0,0,1.0);
    }
    if (bVar4) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar11 = window->Flags;
      DebugNodeDrawList(window,window->Viewport,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,SUB84((double)(window->Size).x,0),
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar21 = "";
      pcVar14 = "Child ";
      if ((uVar11 >> 0x18 & 1) == 0) {
        pcVar14 = "";
      }
      auVar26._0_4_ = -(uint)((uVar11 & 0x10000000) == 0);
      auVar26._4_4_ = -(uint)((uVar11 & 0x8000000) == 0);
      auVar26._8_4_ = -(uint)((uVar11 & 0x4000000) == 0);
      auVar26._12_4_ = -(uint)((uVar11 & 0x2000000) == 0);
      auVar25._0_4_ = -(uint)((uVar11 & 0x40) == 0);
      auVar25._4_4_ = -(uint)((uVar11 & 0x40000) == 0);
      auVar25._8_4_ = -(uint)((uVar11 & 0x200) == 0);
      auVar25._12_4_ = -(uint)((uVar11 & 0x100) == 0);
      auVar26 = packssdw(auVar25,auVar26);
      auVar26 = packsswb(auVar26,auVar26);
      pcVar9 = "Tooltip ";
      if ((auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar9 = "";
      }
      pcVar13 = "Popup ";
      if ((auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar15 = "Modal ";
      if ((auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar16 = "ChildMenu ";
      if ((auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "";
      }
      pcVar17 = "NoSavedSettings ";
      if ((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar17 = "";
      }
      pcVar22 = "NoMouseInputs";
      if ((auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar22 = "";
      }
      pcVar18 = "NoNavInputs";
      if ((auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "";
      }
      pcVar19 = "AlwaysAutoResize";
      if ((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar19 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar11,pcVar14,pcVar9,pcVar13,pcVar15
                 ,pcVar16,pcVar17,pcVar22,pcVar18,pcVar19);
      BulletText("WindowClassId: 0x%08X",(ulong)(window->WindowClass).ClassId);
      pcVar14 = "X";
      if (window->ScrollbarX == false) {
        pcVar14 = "";
      }
      pcVar9 = "Y";
      if (window->ScrollbarY == false) {
        pcVar9 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,SUB84((double)(window->Scroll).y,0),
                 (double)(window->ScrollMax).y,pcVar14,pcVar9);
      if ((window->Active == false) && (window->WasActive == false)) {
        uVar12 = 0xffffffffffffffff;
      }
      else {
        uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      uVar12 = 0;
      for (lVar20 = 0x3b0; lVar20 != 0x3b8; lVar20 = lVar20 + 4) {
        uVar1 = *(undefined8 *)((long)window + lVar20 * 4 + -0xb08);
        uVar2 = *(undefined8 *)((long)window + lVar20 * 4 + -0xb00);
        fVar24 = (float)((ulong)uVar2 >> 0x20);
        fVar23 = (float)((ulong)uVar1 >> 0x20);
        uVar10 = (ulong)*(uint *)((long)&window->Name + lVar20);
        if (((float)uVar1 < fVar24) || (fVar23 < fVar24)) {
          uStack_50 = 0;
          uStack_40 = 0;
          local_58 = uVar1;
          local_48 = uVar2;
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)(float)uVar1,
                     (double)fVar23,SUB84((double)(float)uVar2,0),(double)fVar24,uVar12,uVar10);
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            pIVar7 = GetForegroundDrawList(window);
            fVar23 = (window->Pos).x;
            local_68.x = (float)local_58 + fVar23;
            fVar24 = (window->Pos).y;
            local_68.y = local_58._4_4_ + fVar24;
            local_60.x = (float)local_48 + fVar23;
            local_60.y = local_48._4_4_ + fVar24;
            ImDrawList::AddRect(pIVar7,&local_68,&local_60,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",uVar12,uVar10);
        }
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar14 = "NULL";
      }
      else {
        pcVar14 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar14);
      uVar11 = 0xffffffff;
      uVar12 = 0xffffffff;
      if (window->Viewport != (ImGuiViewportP *)0x0) {
        uVar12 = (ulong)*(uint *)&(window->Viewport->super_ImGuiViewport).field_0x5c;
      }
      if (window->ViewportOwned != false) {
        pcVar21 = " (Owned)";
      }
      BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)",
                 (double)(window->ViewportPos).x,(double)(window->ViewportPos).y,uVar12,pcVar21,
                 (ulong)window->ViewportId);
      if (window->Viewport != (ImGuiViewportP *)0x0) {
        uVar11 = (uint)window->Viewport->PlatformMonitor;
      }
      BulletText("ViewportMonitor: %d",(ulong)uVar11);
      BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d",(ulong)window->DockId,
                 (ulong)(uint)(int)window->DockOrder,(ulong)((byte)window->field_0x3e1 & 1),
                 (ulong)((byte)window->field_0x3e1 >> 2 & 1));
      pIVar3 = window->DockNodeAsHost;
      if (window->DockNode != (ImGuiDockNode *)0x0 || pIVar3 != (ImGuiDockNode *)0x0) {
        node = window->DockNode;
        if (pIVar3 != (ImGuiDockNode *)0x0) {
          node = pIVar3;
        }
        pcVar14 = "DockNodeAsHost";
        if (pIVar3 == (ImGuiDockNode *)0x0) {
          pcVar14 = "DockNode";
        }
        DebugNodeDockNode(node,pcVar14);
      }
      pIVar8 = window;
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
        pIVar8 = window->RootWindow;
      }
      if (window->RootWindowDockTree != pIVar8) {
        DebugNodeWindow(window->RootWindowDockTree,"RootWindowDockTree");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        i = 0;
        bVar6 = TreeNode("Columns","Columns sets (%d)");
        if (bVar6) {
          for (; i < (window->ColumnsStorage).Size; i = i + 1) {
            columns = ImVector<ImGuiOldColumns>::operator[](&window->ColumnsStorage,i);
            DebugNodeColumns(columns);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("WindowClassId: 0x%08X", window->WindowClass.ClassId);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");

    BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)", window->Viewport ? window->Viewport->Idx : -1, window->ViewportOwned ? " (Owned)" : "", window->ViewportId, window->ViewportPos.x, window->ViewportPos.y);
    BulletText("ViewportMonitor: %d", window->Viewport ? window->Viewport->PlatformMonitor : -1);
    BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d", window->DockId, window->DockOrder, window->DockIsActive, window->DockTabIsVisible);
    if (window->DockNode || window->DockNodeAsHost)
        DebugNodeDockNode(window->DockNodeAsHost ? window->DockNodeAsHost : window->DockNode, window->DockNodeAsHost ? "DockNodeAsHost" : "DockNode");

    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->RootWindowDockTree != window->RootWindow) { DebugNodeWindow(window->RootWindowDockTree, "RootWindowDockTree"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}